

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameEditSql(sqlite3_context *pCtx,RenameCtx *pRename,char *zSql,char *zNew,int bQuote)

{
  uint uVar1;
  int iVar2;
  sqlite3 *psVar3;
  void *__dest;
  sqlite3 *in_RCX;
  void *in_RDX;
  RenameCtx *in_RSI;
  sqlite3_context *in_RDI;
  int in_R8D;
  char *zReplace;
  u32 nReplace;
  RenameToken *pBest;
  int iOff;
  int nOut;
  int nQuot;
  char *zOut;
  char *zQuot;
  int rc;
  sqlite3 *db;
  int nSql;
  int nNew;
  _func_void_void_ptr *in_stack_ffffffffffffff78;
  sqlite3 *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  sqlite3_context *in_stack_ffffffffffffff90;
  int local_60;
  int local_44;
  uint local_30;
  sqlite3 *local_28;
  int local_4;
  
  local_30 = sqlite3Strlen30((char *)in_stack_ffffffffffffff78);
  local_60 = sqlite3Strlen30((char *)in_stack_ffffffffffffff78);
  psVar3 = sqlite3_context_db_handle(in_RDI);
  local_44 = 0;
  psVar3 = (sqlite3 *)sqlite3MPrintf(psVar3,"\"%w\"",in_RCX);
  if (psVar3 == (sqlite3 *)0x0) {
    local_4 = 7;
  }
  else {
    uVar1 = sqlite3Strlen30((char *)in_stack_ffffffffffffff78);
    local_28 = in_RCX;
    if (in_R8D != 0) {
      local_30 = uVar1;
      local_28 = psVar3;
    }
    __dest = sqlite3DbMallocZero(in_stack_ffffffffffffff80,(u64)in_stack_ffffffffffffff78);
    if (__dest == (void *)0x0) {
      local_44 = 7;
    }
    else {
      memcpy(__dest,in_RDX,(long)local_60);
      while (in_RSI->pList != (RenameToken *)0x0) {
        in_stack_ffffffffffffff90 = (sqlite3_context *)renameColumnTokenNext(in_RSI);
        iVar2 = sqlite3IsIdChar(*((Token *)&in_stack_ffffffffffffff90->pFunc)->z);
        in_stack_ffffffffffffff80 = psVar3;
        in_stack_ffffffffffffff8c = uVar1;
        if (iVar2 != 0) {
          in_stack_ffffffffffffff80 = local_28;
          in_stack_ffffffffffffff8c = local_30;
        }
        iVar2 = (int)((Token *)&in_stack_ffffffffffffff90->pFunc)->z - (int)in_RDX;
        if (*(uint *)&in_stack_ffffffffffffff90->pMem != in_stack_ffffffffffffff8c) {
          memmove((void *)((long)__dest + (ulong)(iVar2 + in_stack_ffffffffffffff8c)),
                  (void *)((long)__dest + (ulong)(iVar2 + *(uint *)&in_stack_ffffffffffffff90->pMem)
                          ),(ulong)(local_60 - (iVar2 + *(uint *)&in_stack_ffffffffffffff90->pMem)))
          ;
          local_60 = (in_stack_ffffffffffffff8c - *(uint *)&in_stack_ffffffffffffff90->pMem) +
                     local_60;
          *(undefined1 *)((long)__dest + (long)local_60) = 0;
        }
        memcpy((void *)((long)__dest + (long)iVar2),in_stack_ffffffffffffff80,
               (ulong)in_stack_ffffffffffffff8c);
        sqlite3DbFree(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      sqlite3_result_text(in_stack_ffffffffffffff90,
                          (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),in_stack_ffffffffffffff78)
      ;
      sqlite3DbFree(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    sqlite3_free((void *)0x1df950);
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

static int renameEditSql(
  sqlite3_context *pCtx,          /* Return result here */
  RenameCtx *pRename,             /* Rename context */
  const char *zSql,               /* SQL statement to edit */
  const char *zNew,               /* New token text */
  int bQuote                      /* True to always quote token */
){
  int nNew = sqlite3Strlen30(zNew);
  int nSql = sqlite3Strlen30(zSql);
  sqlite3 *db = sqlite3_context_db_handle(pCtx);
  int rc = SQLITE_OK;
  char *zQuot;
  char *zOut;
  int nQuot;

  /* Set zQuot to point to a buffer containing a quoted copy of the 
  ** identifier zNew. If the corresponding identifier in the original 
  ** ALTER TABLE statement was quoted (bQuote==1), then set zNew to
  ** point to zQuot so that all substitutions are made using the
  ** quoted version of the new column name.  */
  zQuot = sqlite3MPrintf(db, "\"%w\"", zNew);
  if( zQuot==0 ){
    return SQLITE_NOMEM;
  }else{
    nQuot = sqlite3Strlen30(zQuot);
  }
  if( bQuote ){
    zNew = zQuot;
    nNew = nQuot;
  }

  /* At this point pRename->pList contains a list of RenameToken objects
  ** corresponding to all tokens in the input SQL that must be replaced
  ** with the new column name. All that remains is to construct and
  ** return the edited SQL string. */
  assert( nQuot>=nNew );
  zOut = sqlite3DbMallocZero(db, nSql + pRename->nList*nQuot + 1);
  if( zOut ){
    int nOut = nSql;
    memcpy(zOut, zSql, nSql);
    while( pRename->pList ){
      int iOff;                   /* Offset of token to replace in zOut */
      RenameToken *pBest = renameColumnTokenNext(pRename);

      u32 nReplace;
      const char *zReplace;
      if( sqlite3IsIdChar(*pBest->t.z) ){
        nReplace = nNew;
        zReplace = zNew;
      }else{
        nReplace = nQuot;
        zReplace = zQuot;
      }

      iOff = pBest->t.z - zSql;
      if( pBest->t.n!=nReplace ){
        memmove(&zOut[iOff + nReplace], &zOut[iOff + pBest->t.n], 
            nOut - (iOff + pBest->t.n)
        );
        nOut += nReplace - pBest->t.n;
        zOut[nOut] = '\0';
      }
      memcpy(&zOut[iOff], zReplace, nReplace);
      sqlite3DbFree(db, pBest);
    }

    sqlite3_result_text(pCtx, zOut, -1, SQLITE_TRANSIENT);
    sqlite3DbFree(db, zOut);
  }else{
    rc = SQLITE_NOMEM;
  }

  sqlite3_free(zQuot);
  return rc;
}